

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin.c
# Opt level: O3

_Bool duckdb_je_bin_update_shard_size
                (uint *bin_shard_sizes,size_t start_size,size_t end_size,size_t nshards)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  if (start_size < 0x3801 && 0xffffffffffffffbf < nshards - 0x41) {
    sVar4 = 0x3800;
    if (end_size < 0x3800) {
      sVar4 = end_size;
    }
    uVar5 = 0;
    uVar6 = 0;
    if (8 < start_size) {
      uVar1 = start_size * 2 - 1;
      lVar2 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar6 = (uint)lVar2;
      iVar7 = uVar6 - 6;
      if (uVar6 < 6) {
        iVar7 = 0;
      }
      bVar3 = 4;
      if (6 < uVar6) {
        bVar3 = 0x3c - ((byte)lVar2 ^ 0x3f);
      }
      uVar6 = ((uint)(((start_size - 1 >> (bVar3 & 0x3f)) << (bVar3 & 0x3f)) >> (bVar3 & 0x3f)) & 3)
              + iVar7 * 4 + 1;
    }
    if (8 < end_size) {
      uVar1 = sVar4 * 2 - 1;
      lVar2 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar5 = (uint)lVar2;
      iVar7 = uVar5 - 6;
      if (uVar5 < 6) {
        iVar7 = 0;
      }
      bVar3 = 4;
      if (6 < uVar5) {
        bVar3 = 0x3c - ((byte)lVar2 ^ 0x3f);
      }
      uVar5 = ((uint)(((sVar4 - 1 >> (bVar3 & 0x3f)) << (bVar3 & 0x3f)) >> (bVar3 & 0x3f)) & 3) +
              iVar7 * 4 + 1;
    }
    for (; uVar6 <= uVar5; uVar6 = uVar6 + 1) {
      bin_shard_sizes[uVar6] = (uint)nshards;
    }
  }
  return nshards - 0x41 < 0xffffffffffffffc0;
}

Assistant:

bool
bin_update_shard_size(unsigned bin_shard_sizes[SC_NBINS], size_t start_size,
    size_t end_size, size_t nshards) {
	if (nshards > BIN_SHARDS_MAX || nshards == 0) {
		return true;
	}

	if (start_size > SC_SMALL_MAXCLASS) {
		return false;
	}
	if (end_size > SC_SMALL_MAXCLASS) {
		end_size = SC_SMALL_MAXCLASS;
	}

	/* Compute the index since this may happen before sz init. */
	szind_t ind1 = sz_size2index_compute(start_size);
	szind_t ind2 = sz_size2index_compute(end_size);
	for (unsigned i = ind1; i <= ind2; i++) {
		bin_shard_sizes[i] = (unsigned)nshards;
	}

	return false;
}